

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void wait_child(int signo)

{
  int local_14;
  __pid_t local_10;
  int wstatus;
  pid_t pid;
  int signo_local;
  
  wstatus = signo;
  do {
    local_10 = waitpid(0,&local_14,1);
  } while (0 < local_10);
  return;
}

Assistant:

void wait_child(int signo) {
    pid_t pid;
    int wstatus;
    while ((pid = waitpid(0, &wstatus, WNOHANG)) > 0) {
        /*
        if (WIFEXITED(wstatus)) {
            cout << "process[" << pid << "] exited with " << WEXITSTATUS(wstatus) << endl;
        } else {
            cout << "process[" << pid << "] was terminated by signal " << WTERMSIG(wstatus) << endl;
        }
         */
    }

}